

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

void __thiscall cmCTestScriptHandler::cmCTestScriptHandler(cmCTestScriptHandler *this)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_28 [3];
  cmCTestScriptHandler *local_10;
  cmCTestScriptHandler *this_local;
  
  local_10 = this;
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_00b86a50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ConfigurationScripts);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->ScriptProcessScope);
  std::__cxx11::string::string((string *)&this->SourceDir);
  std::__cxx11::string::string((string *)&this->BinaryDir);
  std::__cxx11::string::string((string *)&this->BackupSourceDir);
  std::__cxx11::string::string((string *)&this->BackupBinaryDir);
  std::__cxx11::string::string((string *)&this->CTestRoot);
  std::__cxx11::string::string((string *)&this->CVSCheckOut);
  std::__cxx11::string::string((string *)&this->CTestCmd);
  std::__cxx11::string::string((string *)&this->UpdateCmd);
  std::__cxx11::string::string((string *)&this->CTestEnv);
  std::__cxx11::string::string((string *)&this->InitialCache);
  std::__cxx11::string::string((string *)&this->CMakeCmd);
  std::__cxx11::string::string((string *)&this->CMOutFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ExtraUpdates);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->ScriptStartTime);
  this->Backup = false;
  this->EmptyBinDir = false;
  this->EmptyBinDirOnce = false;
  this->Makefile = (cmMakefile *)0x0;
  this->ParentMakefile = (cmMakefile *)0x0;
  this->CMake = (cmake *)0x0;
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(local_28);
  (this->ScriptStartTime).__d.__r = (rep)local_28[0].__d.__r;
  this->MinimumInterval = 1800.0;
  this->ContinuousDuration = -1.0;
  return;
}

Assistant:

cmCTestScriptHandler::cmCTestScriptHandler()
{
  this->Backup = false;
  this->EmptyBinDir = false;
  this->EmptyBinDirOnce = false;
  this->Makefile = nullptr;
  this->ParentMakefile = nullptr;
  this->CMake = nullptr;
  this->GlobalGenerator = nullptr;

  this->ScriptStartTime = std::chrono::steady_clock::time_point();

  // the *60 is because the settings are in minutes but GetTime is seconds
  this->MinimumInterval = 30 * 60;
  this->ContinuousDuration = -1;
}